

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

time_t cs_impl::runtime_cs_ext::time(time_t *__timer)

{
  unsigned_long local_10;
  time_t *local_8;
  
  local_8 = __timer;
  local_10 = cov::timer::time((time_t *)0x2);
  cs::numeric::numeric<unsigned_long>((numeric *)__timer,&local_10);
  return (time_t)__timer;
}

Assistant:

numeric time()
		{
			return cov::timer::time(cov::timer::time_unit::milli_sec);
		}